

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperBase::Clear(ClipperBase *this)

{
  size_type sVar1;
  reference ppTVar2;
  ulong local_18;
  size_type i;
  ClipperBase *this_local;
  
  DisposeLocalMinimaList(this);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>::size
                      (&this->m_edges);
    if (sVar1 <= local_18) break;
    ppTVar2 = std::vector<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>::operator[]
                        (&this->m_edges,local_18);
    if (*ppTVar2 != (value_type)0x0) {
      operator_delete__(*ppTVar2);
    }
    local_18 = local_18 + 1;
  }
  std::vector<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>::clear(&this->m_edges);
  this->m_UseFullRange = false;
  return;
}

Assistant:

void ClipperBase::Clear()
{
  DisposeLocalMinimaList();
  for (EdgeList::size_type i = 0; i < m_edges.size(); ++i) delete [] m_edges[i];
  m_edges.clear();
  m_UseFullRange = false;
}